

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mri_tables.c
# Opt level: O2

void MRIStepCoupling_Free(MRIStepCoupling MRIC)

{
  sunrealtype *psVar1;
  int *__ptr;
  long lVar2;
  long lVar3;
  
  if (MRIC != (MRIStepCoupling)0x0) {
    free(MRIC->c);
    if (MRIC->W != (sunrealtype ***)0x0) {
      for (lVar2 = 0; lVar2 < MRIC->nmat; lVar2 = lVar2 + 1) {
        if (MRIC->W[lVar2] != (sunrealtype **)0x0) {
          for (lVar3 = 0; lVar3 <= MRIC->stages; lVar3 = lVar3 + 1) {
            psVar1 = MRIC->W[lVar2][lVar3];
            if (psVar1 != (sunrealtype *)0x0) {
              free(psVar1);
              MRIC->W[lVar2][lVar3] = (sunrealtype *)0x0;
            }
          }
          free(MRIC->W[lVar2]);
          MRIC->W[lVar2] = (sunrealtype **)0x0;
        }
      }
      free(MRIC->W);
    }
    if (MRIC->G != (sunrealtype ***)0x0) {
      for (lVar2 = 0; lVar2 < MRIC->nmat; lVar2 = lVar2 + 1) {
        if (MRIC->G[lVar2] != (sunrealtype **)0x0) {
          for (lVar3 = 0; lVar3 <= MRIC->stages; lVar3 = lVar3 + 1) {
            psVar1 = MRIC->G[lVar2][lVar3];
            if (psVar1 != (sunrealtype *)0x0) {
              free(psVar1);
              MRIC->G[lVar2][lVar3] = (sunrealtype *)0x0;
            }
          }
          free(MRIC->G[lVar2]);
          MRIC->G[lVar2] = (sunrealtype **)0x0;
        }
      }
      free(MRIC->G);
    }
    if (MRIC->group != (int **)0x0) {
      for (lVar2 = 0; lVar2 < MRIC->stages; lVar2 = lVar2 + 1) {
        __ptr = MRIC->group[lVar2];
        if (__ptr != (int *)0x0) {
          free(__ptr);
          MRIC->group[lVar2] = (int *)0x0;
        }
      }
      free(MRIC->group);
    }
    free(MRIC);
    return;
  }
  return;
}

Assistant:

void MRIStepCoupling_Free(MRIStepCoupling MRIC)
{
  int k, i;

  /* Free each field within MRIStepCoupling structure, and then
     free structure itself */
  if (MRIC)
  {
    if (MRIC->c) { free(MRIC->c); }

    if (MRIC->W)
    {
      for (k = 0; k < MRIC->nmat; k++)
      {
        if (MRIC->W[k])
        {
          for (i = 0; i <= MRIC->stages; i++)
          {
            if (MRIC->W[k][i])
            {
              free(MRIC->W[k][i]);
              MRIC->W[k][i] = NULL;
            }
          }
          free(MRIC->W[k]);
          MRIC->W[k] = NULL;
        }
      }
      free(MRIC->W);
    }

    if (MRIC->G)
    {
      for (k = 0; k < MRIC->nmat; k++)
      {
        if (MRIC->G[k])
        {
          for (i = 0; i <= MRIC->stages; i++)
          {
            if (MRIC->G[k][i])
            {
              free(MRIC->G[k][i]);
              MRIC->G[k][i] = NULL;
            }
          }
          free(MRIC->G[k]);
          MRIC->G[k] = NULL;
        }
      }
      free(MRIC->G);
    }

    if (MRIC->group)
    {
      for (i = 0; i < MRIC->stages; i++)
      {
        if (MRIC->group[i])
        {
          free(MRIC->group[i]);
          MRIC->group[i] = NULL;
        }
      }
      free(MRIC->group);
    }

    free(MRIC);
  }
}